

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::MakeCurrentPerfCase::iterate(MakeCurrentPerfCase *this)

{
  deUint32 dVar1;
  size_type sVar2;
  reference ppvVar3;
  deUint64 dVar4;
  bool bVar5;
  value_type_conflict9 local_50;
  value_type local_48;
  EGLSurface surface;
  EGLContext context;
  deUint64 dStack_30;
  int iteration;
  deUint64 beginTimeUs;
  EGLDisplay display;
  Library *egl;
  MakeCurrentPerfCase *this_local;
  
  egl = (Library *)this;
  display = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples);
  if (sVar2 == 0) {
    logTestInfo(this);
  }
  beginTimeUs = (deUint64)this->m_display;
  dStack_30 = deGetMicroseconds();
  for (context._4_4_ = 0; context._4_4_ < (this->m_spec).iterationCount;
      context._4_4_ = context._4_4_ + 1) {
    dVar1 = de::Random::getUint32(&this->m_rnd);
    sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_contexts);
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_contexts,(ulong)dVar1 % sVar2);
    surface = *ppvVar3;
    dVar1 = de::Random::getUint32(&this->m_rnd);
    sVar2 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->m_surfaces);
    ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        (&this->m_surfaces,(ulong)dVar1 % sVar2);
    local_48 = *ppvVar3;
    (**(code **)(*display + 0x138))(display,beginTimeUs,local_48,local_48,surface);
    if (((this->m_spec).release & 1U) != 0) {
      (**(code **)(*display + 0x138))(display,beginTimeUs,0,0);
    }
  }
  dVar4 = deGetMicroseconds();
  local_50 = dVar4 - dStack_30;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->m_samples,&local_50);
  (**(code **)(*display + 0x138))(display,beginTimeUs,0,0);
  dVar1 = (**(code **)(*display + 0xf8))();
  eglu::checkError(dVar1,"eglMakeCurrent()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0x214);
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->m_samples);
  bVar5 = (int)sVar2 != (this->m_spec).sampleCount;
  if (!bVar5) {
    logResults(this);
  }
  this_local._4_4_ = (IterateResult)bVar5;
  return this_local._4_4_;
}

Assistant:

TestCase::IterateResult MakeCurrentPerfCase::iterate (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();
	if (m_samples.size() == 0)
		logTestInfo();

	{
		EGLDisplay	display		= m_display;
		deUint64	beginTimeUs	= deGetMicroseconds();

		for (int iteration = 0; iteration < m_spec.iterationCount; iteration++)
		{
			EGLContext	context = m_contexts[m_rnd.getUint32() % m_contexts.size()];
			EGLSurface	surface	= m_surfaces[m_rnd.getUint32() % m_surfaces.size()];

			egl.makeCurrent(display, surface, surface, context);

			if (m_spec.release)
				egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		}

		m_samples.push_back(deGetMicroseconds() - beginTimeUs);

		egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent()");
	}

	if ((int)m_samples.size() == m_spec.sampleCount)
	{
		logResults();
		return STOP;
	}
	else
		return CONTINUE;
}